

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::RandomOrderTexImage2DCase::createTexture(RandomOrderTexImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  uint uVar3;
  deUint32 type;
  undefined1 auVar4 [16];
  uint uVar5;
  deUint32 dVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int ndx;
  size_type sVar10;
  int height;
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float afVar14 [4];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  deUint32 tex;
  int local_fc;
  size_type local_f8;
  vector<int,_std::allocator<int>_> levels;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_98;
  float local_68 [4];
  TextureLevel levelData;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  sVar10 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar3 = (this->super_TextureSpecCase).m_width;
    uVar5 = 0x20;
    uVar7 = 0x20;
    if (uVar3 != 0) {
      uVar7 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar3 = (this->super_TextureSpecCase).m_height;
    if (uVar3 != 0) {
      uVar5 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    iVar11 = 0x1f - uVar5;
    if ((int)(0x1f - uVar5) < (int)(0x1f - uVar7)) {
      iVar11 = 0x1f - uVar7;
    }
    sVar10 = (size_type)(iVar11 + 1);
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar6 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar6);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_f8 = sVar10;
  std::vector<int,_std::allocator<int>_>::vector(&levels,sVar10,(allocator_type *)&local_98);
  auVar4 = _DAT_019f5ce0;
  if ((int)sVar10 != 0) {
    lVar8 = local_f8 - 1;
    auVar13._8_4_ = (int)lVar8;
    auVar13._0_8_ = lVar8;
    auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar9 = 0;
    auVar13 = auVar13 ^ _DAT_019f5ce0;
    auVar15 = _DAT_019fcc00;
    do {
      auVar16 = auVar15 ^ auVar4;
      if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                  auVar13._4_4_ < auVar16._4_4_) & 1)) {
        levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = (int)uVar9;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9 + 1] = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar8 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar8 + 2;
    } while (((int)local_f8 + 1U & 0xfffffffe) != uVar9);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  if ((int)sVar10 != 0) {
    sVar10 = 0;
    do {
      local_fc = levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar10];
      iVar11 = (this->super_TextureSpecCase).m_width >> ((byte)local_fc & 0x1f);
      height = (this->super_TextureSpecCase).m_height >> ((byte)local_fc & 0x1f);
      local_98.super_ConstPixelBufferAccess.m_format.order = R;
      local_98.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      gMax.m_data[2] = 1.0;
      gMax.m_data[3] = 1.0;
      gMax.m_data[0] = 1.0;
      gMax.m_data[1] = 1.0;
      if (height < 2) {
        height = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar8 = 0;
      do {
        fVar1 = (float)local_98.super_ConstPixelBufferAccess.m_size.m_data[lVar8 + -2];
        fVar2 = gMax.m_data[lVar8];
        fVar12 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar8] = (fVar2 - fVar1) * fVar12 + fVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      afVar14 = (float  [4])ZEXT416(0);
      local_98.super_ConstPixelBufferAccess.m_format.order = (ChannelOrder)afVar14[0];
      local_98.super_ConstPixelBufferAccess.m_format.type = (ChannelType)afVar14[1];
      local_98.super_ConstPixelBufferAccess.m_size.m_data[0] = (int)afVar14[2];
      local_98.super_ConstPixelBufferAccess.m_size.m_data[1] = (int)afVar14[3];
      local_68[0] = 1.0;
      local_68[1] = 1.0;
      local_68[2] = 1.0;
      local_68[3] = 1.0;
      gMax.m_data[0] = afVar14[0];
      gMax.m_data[1] = afVar14[1];
      gMax.m_data[2] = afVar14[2];
      gMax.m_data[3] = afVar14[3];
      lVar8 = 0;
      do {
        fVar1 = (float)local_98.super_ConstPixelBufferAccess.m_size.m_data[lVar8 + -2];
        fVar2 = local_68[lVar8];
        fVar12 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar8] = (fVar2 - fVar1) * fVar12 + fVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      tcu::TextureLevel::setSize(&levelData,iVar11,height,1);
      tcu::TextureLevel::getAccess(&local_98,&levelData);
      tcu::fillWithComponentGradients(&local_98,&gMin,&gMax);
      dVar6 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_98,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,local_fc,dVar6,iVar11,height,0,dVar6,type,
                 local_98.super_ConstPixelBufferAccess.m_data);
      sVar10 = sVar10 + 1;
    } while (sVar10 != local_f8);
  }
  if (levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		vector<int>			levels		(numLevels);

		for (int i = 0; i < numLevels; i++)
			levels[i] = i;
		rnd.shuffle(levels.begin(), levels.end());

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelNdx	= levels[ndx];
			int		levelW		= de::max(1, m_width	>> levelNdx);
			int		levelH		= de::max(1, m_height	>> levelNdx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, levelNdx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}